

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

QVariant * __thiscall
QTableModel::headerData
          (QVariant *__return_storage_ptr__,QTableModel *this,int section,Orientation orientation,
          int role)

{
  long *plVar1;
  long lVar2;
  
  if (-1 < section) {
    if (orientation == Vertical) {
      lVar2 = 0x38;
      if ((ulong)(this->verticalHeaderItems).d.size <= (ulong)(uint)section) goto LAB_0059f7e5;
    }
    else if ((orientation != Horizontal) ||
            (lVar2 = 0x50, (ulong)(this->horizontalHeaderItems).d.size <= (ulong)(uint)section))
    goto LAB_0059f7e5;
    plVar1 = *(long **)(*(long *)(&this->super_QAbstractTableModel + lVar2) +
                       (ulong)(uint)section * 8);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x18))(__return_storage_ptr__,plVar1,role);
      return __return_storage_ptr__;
    }
    if (role == 0) {
      ::QVariant::QVariant(__return_storage_ptr__,section + 1);
      return __return_storage_ptr__;
    }
  }
LAB_0059f7e5:
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  return __return_storage_ptr__;
}

Assistant:

QVariant QTableModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    if (section < 0)
        return QVariant();

    QTableWidgetItem *itm = nullptr;
    if (orientation == Qt::Horizontal && section < horizontalHeaderItems.size())
        itm = horizontalHeaderItems.at(section);
    else if (orientation == Qt::Vertical && section < verticalHeaderItems.size())
        itm = verticalHeaderItems.at(section);
    else
        return QVariant(); // section is out of bounds

    if (itm)
        return itm->data(role);
    if (role == Qt::DisplayRole)
        return section + 1;
    return QVariant();
}